

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O1

int ishashkey(context *ctx,lua_State *L,int index,int *key,uint32_t *keyhash,int *keytype)

{
  int iVar1;
  int iVar2;
  lua_Integer lVar3;
  char *str;
  undefined4 in_register_00000014;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sz;
  size_t local_38;
  
  iVar2 = ctx->tbl->sizearray;
  iVar1 = lua_type(L,-2);
  if (iVar1 == 3) {
    lVar3 = lua_tointegerx(L,-2,(int *)0x0);
    iVar1 = (int)lVar3;
    *(int *)CONCAT44(in_register_00000014,index) = iVar1;
    if ((0 < iVar1) && (iVar1 <= iVar2)) {
      return 0;
    }
    *key = iVar1;
    *keyhash = 0;
  }
  else {
    local_38 = 0;
    str = lua_tolstring(L,-2,&local_38);
    if (local_38 == 0) {
      uVar4 = 0;
    }
    else {
      uVar5 = local_38 & 0xffffffff;
      sVar6 = local_38;
      do {
        uVar4 = (uint)uVar5 ^ (uint)(byte)str[sVar6 - 1] + (int)(uVar5 >> 2) + (uint)uVar5 * 0x20;
        uVar5 = (ulong)uVar4;
        sVar6 = sVar6 + ~(local_38 >> 5);
      } while (local_38 >> 5 < sVar6);
    }
    *key = uVar4;
    iVar2 = stringindex(ctx,str,local_38);
    *(int *)CONCAT44(in_register_00000014,index) = iVar2;
    *keyhash = 1;
  }
  return 1;
}

Assistant:

static int
ishashkey(struct context * ctx, lua_State *L, int index, int *key, uint32_t *keyhash, int *keytype) {
	int sizearray = ctx->tbl->sizearray;
	int kt = lua_type(L, index);
	if (kt == LUA_TNUMBER) {
		*key = lua_tointeger(L, index);
		if (*key > 0 && *key <= sizearray) {
			return 0;
		}
		*keyhash = (uint32_t)*key;
		*keytype = KEYTYPE_INTEGER;
	} else {
		size_t sz = 0;
		const char * s = lua_tolstring(L, index, &sz);
		*keyhash = calchash(s, sz);
		*key = stringindex(ctx, s, sz);
		*keytype = KEYTYPE_STRING;
	}
	return 1;
}